

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

fy_node * fy_node_sequence_get_by_index(fy_node *fyn,int index)

{
  bool bVar1;
  void *local_30;
  void *iterp;
  fy_node *fyni;
  fy_node *pfStack_18;
  int index_local;
  fy_node *fyn_local;
  
  local_30 = (void *)0x0;
  if ((fyn == (fy_node *)0x0) || ((fyn->field_0x34 & 3) != 1)) {
    fyn_local = (fy_node *)0x0;
  }
  else {
    fyni._4_4_ = index;
    pfStack_18 = fyn;
    if (index < 0) {
      do {
        iterp = fy_node_sequence_reverse_iterate(pfStack_18,&local_30);
        bVar1 = false;
        if ((fy_node *)iterp != (fy_node *)0x0) {
          fyni._4_4_ = fyni._4_4_ + 1;
          bVar1 = fyni._4_4_ < 0;
        }
      } while (bVar1);
    }
    else {
      do {
        iterp = fy_node_sequence_iterate(pfStack_18,&local_30);
        bVar1 = false;
        if ((fy_node *)iterp != (fy_node *)0x0) {
          fyni._4_4_ = fyni._4_4_ + -1;
          bVar1 = -1 < fyni._4_4_;
        }
      } while (bVar1);
    }
    fyn_local = (fy_node *)iterp;
  }
  return fyn_local;
}

Assistant:

struct fy_node *fy_node_sequence_get_by_index(struct fy_node *fyn, int index) {
    struct fy_node *fyni;
    void *iterp = NULL;

    if (!fyn || fyn->type != FYNT_SEQUENCE)
        return NULL;

    if (index >= 0) {
        do {
            fyni = fy_node_sequence_iterate(fyn, &iterp);
        } while (fyni && --index >= 0);
    } else {
        do {
            fyni = fy_node_sequence_reverse_iterate(fyn, &iterp);
        } while (fyni && ++index < 0);
    }

    return fyni;
}